

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_outputParameters_Test::~TEST_MockSupport_c_outputParameters_Test
          (TEST_MockSupport_c_outputParameters_Test *this)

{
  TEST_MockSupport_c_outputParameters_Test *this_local;
  
  ~TEST_MockSupport_c_outputParameters_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockSupport_c, outputParameters)
{
    int param = 1;
    const int retval = 2;
    mock_c()->expectOneCall("foo")->withOutputParameterReturning("out", &retval, sizeof(retval));
    mock_c()->actualCall("foo")->withOutputParameter("out", &param);
    mock_c()->checkExpectations();
    LONGS_EQUAL(2, param);
    LONGS_EQUAL(2, retval);
}